

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O1

int __thiscall DatalogDatabase::totalTuples(DatalogDatabase *this)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  
  iVar3 = 0;
  for (p_Var2 = (this->relations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->relations)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = Relation::size(*(Relation **)(p_Var2 + 2));
    iVar3 = iVar3 + iVar1;
  }
  return iVar3;
}

Assistant:

int DatalogDatabase::totalTuples()
{
  int res = 0;
  for (auto const & pair: relations)
  {
    res += pair.second->size();
  }
  return res;
}